

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O2

int Extra_bddSuppDifferentVars(DdManager *dd,DdNode *S1,DdNode *S2,int DiffMax)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int Result;
  int iVar4;
  
  iVar4 = 0;
  while( true ) {
    uVar1 = S1->index;
    uVar2 = S2->index;
    if ((ulong)uVar1 == 0x7fffffff) break;
    if (uVar2 == 0x7fffffff) goto LAB_0066f7a4;
    if (uVar1 == uVar2) {
      S1 = (S1->type).kids.T;
LAB_0066f775:
      S2 = (S2->type).kids.T;
    }
    else {
      iVar4 = iVar4 + 1;
      if (DiffMax <= iVar4) {
        return DiffMax;
      }
      if (dd->perm[uVar2] <= dd->perm[uVar1]) goto LAB_0066f775;
      S1 = (S1->type).kids.T;
    }
  }
  S1 = S2;
  if (uVar2 != 0x7fffffff) {
LAB_0066f7a4:
    iVar3 = Extra_bddSuppSize(dd,S1);
    iVar4 = iVar4 + iVar3;
  }
  if (iVar4 < DiffMax) {
    DiffMax = iVar4;
  }
  return DiffMax;
}

Assistant:

int Extra_bddSuppDifferentVars( DdManager * dd, DdNode * S1, DdNode * S2, int DiffMax )
{
    int Result = 0;
    while ( S1->index != CUDD_CONST_INDEX && S2->index != CUDD_CONST_INDEX )
    {
        // if the top vars are the same, this var is the same
        if ( S1->index == S2->index )
        {
            S1 = cuddT(S1);
            S2 = cuddT(S2);
            continue;
        }
        // the top var is different
        Result++;

        if ( Result >= DiffMax )
            return DiffMax;

        // if the top vars are different, skip the one, which is higher
        if ( dd->perm[S1->index] < dd->perm[S2->index] )
            S1 = cuddT(S1);
        else
            S2 = cuddT(S2);
    }

    // consider the remaining variables
    if ( S1->index != CUDD_CONST_INDEX )
        Result += Extra_bddSuppSize(dd,S1);
    else if ( S2->index != CUDD_CONST_INDEX )
        Result += Extra_bddSuppSize(dd,S2);

    if ( Result >= DiffMax )
        return DiffMax;
    return Result;
}